

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O3

ChVector<double> * __thiscall
chrono::fea::ChElementShellANCF_3443::ComputeNormal
          (ChVector<double> *__return_storage_ptr__,ChElementShellANCF_3443 *this,double xi,
          double eta)

{
  double dVar1;
  bool bVar2;
  ChVector<double> *v;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  ChVector<double> r_zeta;
  VectorN Sxi_zeta_compact;
  Matrix3xN e_bar;
  Matrix3xN *local_2a8;
  undefined8 *local_2a0;
  ChVector<double> local_298;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  double local_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  double local_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  double local_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  double local_208;
  Matrix3xN local_200;
  
  dVar5 = this->m_thicknessZ * 0.125;
  dVar1 = this->m_thicknessZ * -0.125;
  local_270 = 0;
  local_280 = 0;
  uStack_278 = 0;
  local_268 = (eta + -1.0) * (xi + -1.0) * dVar5;
  local_248 = (xi + 1.0) * dVar1 * (eta + -1.0);
  local_228 = (eta + 1.0) * (xi + 1.0) * dVar5;
  local_260 = 0;
  uStack_258 = 0;
  local_250 = 0;
  local_230 = 0;
  local_240 = 0;
  uStack_238 = 0;
  local_220 = 0;
  uStack_218 = 0;
  local_210 = 0;
  local_208 = (eta + 1.0) * (xi + -1.0) * dVar1;
  CalcCoordMatrix(this,&local_200);
  local_2a8 = &local_200;
  local_2a0 = &local_280;
  ChVector<double>::
  ChVector<Eigen::Product<Eigen::Matrix<double,3,16,1,3,16>,Eigen::Matrix<double,16,1,0,16,1>,0>>
            (&local_298,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_16,_1,_3,_16>,_Eigen::Matrix<double,_16,_1,_0,_16,_1>,_0>_>
              *)&local_2a8,(type *)0x0);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_298.m_data[0];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_298.m_data[2];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_298.m_data[1] * local_298.m_data[1];
  auVar3 = vfmadd231sd_fma(auVar6,auVar3,auVar3);
  auVar3 = vfmadd231sd_fma(auVar3,auVar4,auVar4);
  auVar3 = vsqrtsd_avx(auVar3,auVar3);
  bVar2 = 2.2250738585072014e-308 <= auVar3._0_8_;
  dVar5 = 1.0 / auVar3._0_8_;
  __return_storage_ptr__->m_data[0] =
       (double)((ulong)bVar2 * (long)(local_298.m_data[0] * dVar5) +
               (ulong)!bVar2 * 0x3ff0000000000000);
  __return_storage_ptr__->m_data[1] = (double)((ulong)bVar2 * (long)(local_298.m_data[1] * dVar5));
  __return_storage_ptr__->m_data[2] = (double)((ulong)bVar2 * (long)(local_298.m_data[2] * dVar5));
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChElementShellANCF_3443::ComputeNormal(const double xi, const double eta) {
    VectorN Sxi_zeta_compact;
    Calc_Sxi_zeta_compact(Sxi_zeta_compact, xi, eta, 0, m_thicknessZ, m_midsurfoffset);

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // Calculate the position vector gradient with respect to zeta at the current point (whose length may not equal 1)
    ChVector<> r_zeta = e_bar * Sxi_zeta_compact;

    return r_zeta.GetNormalized();
}